

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O2

ComparisonResult __thiscall
google::protobuf::util::DefaultFieldComparator::Compare
          (DefaultFieldComparator *this,Message *message_1,Message *message_2,FieldDescriptor *field
          ,int index_1,int index_2,FieldContext *field_context)

{
  bool bVar1;
  byte bVar2;
  __type _Var3;
  CppType CVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint64 uVar7;
  uint64 uVar8;
  EnumValueDescriptor *pEVar9;
  EnumValueDescriptor *pEVar10;
  LogMessage *pLVar11;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Reflection *this_00;
  Reflection *this_01;
  ComparisonResult CVar12;
  bool bVar13;
  float fVar14;
  undefined4 uVar15;
  double dVar16;
  undefined4 uVar17;
  undefined8 value_1;
  undefined1 local_a8 [8];
  string scratch1;
  undefined1 local_70 [8];
  string scratch2;
  
  (*(message_1->super_MessageLite)._vptr_MessageLite[0x13])(message_1);
  (*(message_2->super_MessageLite)._vptr_MessageLite[0x13])(message_2);
  CVar4 = FieldDescriptor::cpp_type(field);
  switch(CVar4) {
  case CPPTYPE_INT32:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedInt32(this_00,message_1,field,index_1);
      uVar6 = Reflection::GetRepeatedInt32(this_01,message_2,field,index_2);
    }
    else {
      uVar5 = Reflection::GetInt32(this_00,message_1,field);
      uVar6 = Reflection::GetInt32(this_01,message_2,field);
    }
    goto LAB_00320c5e;
  case CPPTYPE_INT64:
    if (*(int *)(field + 0x3c) == 3) {
      uVar7 = Reflection::GetRepeatedInt64(this_00,message_1,field,index_1);
      uVar8 = Reflection::GetRepeatedInt64(this_01,message_2,field,index_2);
    }
    else {
      uVar7 = Reflection::GetInt64(this_00,message_1,field);
      uVar8 = Reflection::GetInt64(this_01,message_2,field);
    }
    goto LAB_00320c85;
  case CPPTYPE_UINT32:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedUInt32(this_00,message_1,field,index_1);
      uVar6 = Reflection::GetRepeatedUInt32(this_01,message_2,field,index_2);
    }
    else {
      uVar5 = Reflection::GetUInt32(this_00,message_1,field);
      uVar6 = Reflection::GetUInt32(this_01,message_2,field);
    }
LAB_00320c5e:
    bVar13 = uVar5 == uVar6;
LAB_00320c8a:
    CVar12 = (ComparisonResult)!bVar13;
    break;
  case CPPTYPE_UINT64:
    if (*(int *)(field + 0x3c) == 3) {
      uVar7 = Reflection::GetRepeatedUInt64(this_00,message_1,field,index_1);
      uVar8 = Reflection::GetRepeatedUInt64(this_01,message_2,field,index_2);
    }
    else {
      uVar7 = Reflection::GetUInt64(this_00,message_1,field);
      uVar8 = Reflection::GetUInt64(this_01,message_2,field);
    }
LAB_00320c85:
    bVar13 = uVar7 == uVar8;
    goto LAB_00320c8a;
  case CPPTYPE_DOUBLE:
    if (*(int *)(field + 0x3c) == 3) {
      scratch2.field_2._8_8_ = Reflection::GetRepeatedDouble(this_00,message_1,field,index_1);
      dVar16 = Reflection::GetRepeatedDouble(this_01,message_2,field,index_2);
      uVar15 = SUB84(dVar16,0);
      uVar17 = (undefined4)((ulong)dVar16 >> 0x20);
      value_1 = scratch2.field_2._8_8_;
    }
    else {
      value_1 = Reflection::GetDouble(this_00,message_1,field);
      dVar16 = Reflection::GetDouble(this_01,message_2,field);
      uVar15 = SUB84(dVar16,0);
      uVar17 = (undefined4)((ulong)dVar16 >> 0x20);
    }
    bVar13 = CompareDoubleOrFloat<double>
                       (this,field,(double)value_1,(double)CONCAT44(uVar17,uVar15));
    goto LAB_00320cc8;
  case CPPTYPE_FLOAT:
    if (*(int *)(field + 0x3c) == 3) {
      fVar14 = Reflection::GetRepeatedFloat(this_00,message_1,field,index_1);
      scratch2.field_2._8_4_ = fVar14;
      fVar14 = Reflection::GetRepeatedFloat(this_01,message_2,field,index_2);
      uVar15 = scratch2.field_2._8_4_;
    }
    else {
      uVar15 = Reflection::GetFloat(this_00,message_1,field);
      fVar14 = Reflection::GetFloat(this_01,message_2,field);
    }
    bVar13 = CompareDoubleOrFloat<float>(this,field,(float)uVar15,fVar14);
LAB_00320cc8:
    bVar2 = bVar13 ^ 1;
LAB_00320cef:
    CVar12 = (ComparisonResult)bVar2;
    break;
  case CPPTYPE_BOOL:
    if (*(int *)(field + 0x3c) == 3) {
      bVar13 = Reflection::GetRepeatedBool(this_00,message_1,field,index_1);
      bVar1 = Reflection::GetRepeatedBool(this_01,message_2,field,index_2);
    }
    else {
      bVar13 = Reflection::GetBool(this_00,message_1,field);
      bVar1 = Reflection::GetBool(this_01,message_2,field);
    }
    bVar2 = bVar1 ^ bVar13;
    goto LAB_00320cef;
  case CPPTYPE_ENUM:
    if (*(int *)(field + 0x3c) == 3) {
      pEVar9 = Reflection::GetRepeatedEnum(this_00,message_1,field,index_1);
      pEVar10 = Reflection::GetRepeatedEnum(this_01,message_2,field,index_2);
    }
    else {
      pEVar9 = Reflection::GetEnum(this_00,message_1,field);
      pEVar10 = Reflection::GetEnum(this_01,message_2,field);
    }
    bVar13 = *(int *)(pEVar9 + 0x10) == *(int *)(pEVar10 + 0x10);
    goto LAB_00320c8a;
  case CPPTYPE_STRING:
    if (*(int *)(field + 0x3c) == 3) {
      local_a8 = (undefined1  [8])&scratch1._M_string_length;
      scratch1._M_dataplus._M_p = (pointer)0x0;
      scratch1._M_string_length._0_1_ = 0;
      local_70 = (undefined1  [8])&scratch2._M_string_length;
      scratch2._M_dataplus._M_p = (pointer)0x0;
      scratch2._M_string_length._0_1_ = 0;
      __lhs = Reflection::GetRepeatedStringReference
                        (this_00,message_1,field,index_1,(string *)local_a8);
      __rhs = Reflection::GetRepeatedStringReference
                        (this_01,message_2,field,index_2,(string *)local_70);
    }
    else {
      local_a8 = (undefined1  [8])&scratch1._M_string_length;
      scratch1._M_dataplus._M_p = (pointer)0x0;
      scratch1._M_string_length._0_1_ = 0;
      local_70 = (undefined1  [8])&scratch2._M_string_length;
      scratch2._M_dataplus._M_p = (pointer)0x0;
      scratch2._M_string_length._0_1_ = 0;
      __lhs = Reflection::GetStringReference(this_00,message_1,field,(string *)local_a8);
      __rhs = Reflection::GetStringReference(this_01,message_2,field,(string *)local_70);
    }
    _Var3 = std::operator==(__lhs,__rhs);
    CVar12 = (ComparisonResult)!_Var3;
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_a8);
    break;
  case CPPTYPE_MESSAGE:
    CVar12 = RECURSE;
    break;
  default:
    protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_comparator.cc"
               ,0x7c);
    pLVar11 = protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_a8,"No comparison code for field ");
    pLVar11 = protobuf::internal::LogMessage::operator<<(pLVar11,*(string **)(field + 8));
    pLVar11 = protobuf::internal::LogMessage::operator<<(pLVar11," of CppType = ");
    CVar4 = FieldDescriptor::cpp_type(field);
    pLVar11 = protobuf::internal::LogMessage::operator<<(pLVar11,CVar4);
    protobuf::internal::LogFinisher::operator=((LogFinisher *)local_70,pLVar11);
    protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    CVar12 = DIFFERENT;
  }
  return CVar12;
}

Assistant:

FieldComparator::ComparisonResult DefaultFieldComparator::Compare(
    const Message& message_1, const Message& message_2,
    const FieldDescriptor* field, int index_1, int index_2,
    const util::FieldContext* field_context) {
  const Reflection* reflection_1 = message_1.GetReflection();
  const Reflection* reflection_2 = message_2.GetReflection();

  switch (field->cpp_type()) {
#define COMPARE_FIELD(METHOD)                                                 \
  if (field->is_repeated()) {                                                 \
    return ResultFromBoolean(Compare##METHOD(                                 \
        *field, reflection_1->GetRepeated##METHOD(message_1, field, index_1), \
        reflection_2->GetRepeated##METHOD(message_2, field, index_2)));       \
  } else {                                                                    \
    return ResultFromBoolean(                                                 \
        Compare##METHOD(*field, reflection_1->Get##METHOD(message_1, field),  \
                        reflection_2->Get##METHOD(message_2, field)));        \
  }                                                                           \
  break;  // Make sure no fall-through is introduced.

    case FieldDescriptor::CPPTYPE_BOOL:
      COMPARE_FIELD(Bool);
    case FieldDescriptor::CPPTYPE_DOUBLE:
      COMPARE_FIELD(Double);
    case FieldDescriptor::CPPTYPE_ENUM:
      COMPARE_FIELD(Enum);
    case FieldDescriptor::CPPTYPE_FLOAT:
      COMPARE_FIELD(Float);
    case FieldDescriptor::CPPTYPE_INT32:
      COMPARE_FIELD(Int32);
    case FieldDescriptor::CPPTYPE_INT64:
      COMPARE_FIELD(Int64);
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->is_repeated()) {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(
            CompareString(*field,
                          reflection_1->GetRepeatedStringReference(
                              message_1, field, index_1, &scratch1),
                          reflection_2->GetRepeatedStringReference(
                              message_2, field, index_2, &scratch2)));
      } else {
        // Allocate scratch strings to store the result if a conversion is
        // needed.
        std::string scratch1;
        std::string scratch2;
        return ResultFromBoolean(CompareString(
            *field,
            reflection_1->GetStringReference(message_1, field, &scratch1),
            reflection_2->GetStringReference(message_2, field, &scratch2)));
      }
      break;
    case FieldDescriptor::CPPTYPE_UINT32:
      COMPARE_FIELD(UInt32);
    case FieldDescriptor::CPPTYPE_UINT64:
      COMPARE_FIELD(UInt64);

#undef COMPARE_FIELD

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return RECURSE;

    default:
      GOOGLE_LOG(FATAL) << "No comparison code for field " << field->full_name()
                 << " of CppType = " << field->cpp_type();
      return DIFFERENT;
  }
}